

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCommandLine.cpp
# Opt level: O0

bool __thiscall tcu::CaseListFilter::checkTestCaseName(CaseListFilter *this,char *caseName)

{
  char *__s;
  bool bVar1;
  CasePaths *this_00;
  allocator<char> local_41;
  string local_40;
  char *local_20;
  char *caseName_local;
  CaseListFilter *this_local;
  
  local_20 = caseName;
  caseName_local = (char *)this;
  bVar1 = de::details::UniqueBase::operator_cast_to_bool((UniqueBase *)&this->m_casePaths);
  if (bVar1) {
    this_00 = de::details::
              UniqueBase<const_tcu::CasePaths,_de::DefaultDeleter<const_tcu::CasePaths>_>::
              operator->(&(this->m_casePaths).
                          super_UniqueBase<const_tcu::CasePaths,_de::DefaultDeleter<const_tcu::CasePaths>_>
                        );
    __s = local_20;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,__s,&local_41);
    this_local._7_1_ = CasePaths::matches(this_00,&local_40,false);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
  }
  else if (this->m_caseTree == (CaseTreeNode *)0x0) {
    this_local._7_1_ = 1;
  }
  else {
    this_local._7_1_ = tcu::checkTestCaseName(this->m_caseTree,local_20);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool CaseListFilter::checkTestCaseName (const char* caseName) const
{
	if (m_casePaths)
		return m_casePaths->matches(caseName, false);
	else if (m_caseTree)
		return tcu::checkTestCaseName(m_caseTree, caseName);
	else
		return true;
}